

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

MTBDD mtbdd_set_add(MTBDD set,uint32_t var)

{
  MTBDD MVar1;
  long lVar2;
  ulong set_00;
  uint uVar3;
  
  lVar2 = (set & 0xffffffffff) * 0x10;
  uVar3 = (uint)((ulong)*(undefined8 *)(nodes->data + lVar2 + 8) >> 0x28);
  MVar1 = set;
  if ((uVar3 <= var) &&
     ((uVar3 == var ||
      (set_00 = set & 0x8000000000000000 ^ *(ulong *)(nodes->data + lVar2) & 0x800000ffffffffff,
      MVar1 = mtbdd_set_add(set_00,var), var = uVar3, set_00 == MVar1)))) {
    return set;
  }
  MVar1 = mtbdd_makenode(var,0,MVar1);
  return MVar1;
}

Assistant:

MTBDD
mtbdd_set_add(MTBDD set, uint32_t var)
{
    if (set == mtbdd_true) return mtbdd_makenode(var, mtbdd_false, mtbdd_true);

    mtbddnode_t set_node = MTBDD_GETNODE(set);
    uint32_t set_var = mtbddnode_getvariable(set_node);
    if (var < set_var) return mtbdd_makenode(var, mtbdd_false, set);
    else if (set_var == var) return set;
    else {
        MTBDD sub = mtbddnode_followhigh(set, set_node);
        MTBDD res = mtbdd_set_add(sub, var);
        res = sub == res ? set : mtbdd_makenode(set_var, mtbdd_false, res);
        return res;
    }
}